

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_string.cpp
# Opt level: O0

string * duckdb::StandardStringCast<duckdb::date_t>(date_t input)

{
  undefined4 in_ESI;
  string *in_RDI;
  anon_union_16_2_67f50693_for_value aVar1;
  Vector v;
  undefined4 in_stack_ffffffffffffff48;
  idx_t in_stack_ffffffffffffff50;
  date_t input_00;
  LogicalType *in_stack_ffffffffffffff58;
  Vector *in_stack_ffffffffffffff60;
  LogicalType local_90 [5];
  undefined4 local_c;
  
  local_c = in_ESI;
  LogicalType::LogicalType(local_90,(LogicalTypeId)((ulong)in_RDI >> 0x38));
  Vector::Vector(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  input_00.days = (int32_t)(in_stack_ffffffffffffff50 >> 0x20);
  LogicalType::~LogicalType((LogicalType *)0x32ffb7);
  aVar1.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringCast::Operation<duckdb::date_t>
                 (input_00,(Vector *)CONCAT44(local_c,in_stack_ffffffffffffff48));
  string_t::GetString_abi_cxx11_(aVar1._8_8_);
  Vector::~Vector((Vector *)aVar1.pointer.ptr);
  return in_RDI;
}

Assistant:

string StandardStringCast(T input) {
	Vector v(LogicalType::VARCHAR);
	return StringCast::Operation(input, v).GetString();
}